

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O2

void run_CALL(WorkerP *w,Task *__dq_head)

{
  uint32_t uVar1;
  int *piVar2;
  MDD MVar3;
  MDD arg_4;
  char *__s;
  FILE *mtbdd;
  FILE *lddmc;
  FILE *pFVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  void *__ptr;
  size_t sVar8;
  MDD MVar9;
  MTBDD MVar10;
  set_t psVar11;
  int iVar12;
  uint32_t arg_3;
  int arg_3_00;
  uint32_t arg_3_01;
  int arg_3_02;
  uint32_t arg_3_03;
  int arg_3_04;
  ulong uVar13;
  undefined8 uVar14;
  int i_5;
  uint uVar15;
  int i_2;
  ulong uVar16;
  undefined1 *__ptr_00;
  int i;
  int iVar17;
  long lVar18;
  rel_t prVar19;
  bool bVar20;
  double dVar21;
  lddmc_satcount_double_t lVar22;
  int *piStack_d0;
  set_t local_c8;
  MTBDD new_states;
  MTBDD local_b8;
  MTBDD state_vars;
  MTBDD new_initial;
  MTBDD local_a0;
  MTBDD new_rel;
  undefined1 local_90 [8];
  uint32_t len;
  FILE *local_80;
  rel_t prStack_78;
  uint *local_70;
  char local_68 [24];
  set_t local_50;
  uint local_44;
  MDD MStack_40;
  uint32_t highest_action;
  int local_38;
  uint local_34;
  int has_reachable;
  int action_labels_count;
  
  __ptr_00 = (undefined1 *)&stack0xffffffffffffff38;
  piStack_d0 = (int *)0x1037db;
  pFVar4 = fopen(model_filename,"rb");
  if (pFVar4 == (FILE *)0x0) {
    piStack_d0 = (int *)0x10430e;
    fprintf(_stderr,"Cannot open file \'%s\'!\n",model_filename);
    uVar14 = 0x220;
  }
  else {
    piStack_d0 = (int *)0x1037fc;
    sVar5 = fread(&vector_size,4,1,pFVar4);
    if (sVar5 == 1) {
      if (verbose == '\x01') {
        piStack_d0 = (int *)0x10381b;
        puts("Loading initial state.");
      }
      piStack_d0 = (int *)0x103823;
      local_50 = set_load_RUN((FILE *)pFVar4);
      piStack_d0 = (int *)0x10383c;
      sVar5 = fread(&next_count,4,1,pFVar4);
      if (sVar5 == 1) {
        piStack_d0 = (int *)0x103856;
        next = (rel_t *)malloc((long)next_count << 3);
        if (verbose == '\x01') {
          piStack_d0 = (int *)0x103872;
          puts("Loading transition relations.");
        }
        for (lVar18 = 0; uVar6 = (ulong)next_count, lVar18 < (long)uVar6; lVar18 = lVar18 + 1) {
          local_90 = (undefined1  [8])rel_load_proj_WRAP;
          _len = (_Worker *)0x1;
          piStack_d0 = (int *)0x1038aa;
          local_80 = pFVar4;
          lace_run_task((Task *)local_90);
          next[lVar18] = (rel_t)local_80;
        }
        for (lVar18 = 0; lVar18 < (int)uVar6; lVar18 = lVar18 + 1) {
          prStack_78 = next[lVar18];
          local_90 = (undefined1  [8])rel_load_WRAP;
          _len = (_Worker *)0x1;
          piStack_d0 = (int *)0x103900;
          local_80 = pFVar4;
          lace_run_task((Task *)local_90);
          uVar6 = (ulong)(uint)next_count;
        }
        local_38 = 0;
        piStack_d0 = (int *)0x103920;
        sVar5 = fread(&local_38,4,1,pFVar4);
        if (sVar5 == 1) {
          if (local_38 == 0) {
            piStack_d0 = (int *)0x1043c8;
            fwrite("Input file missing reachable states!\n",0x25,1,_stderr);
            uVar14 = 0x235;
            __ptr_00 = (undefined1 *)&stack0xffffffffffffff38;
          }
          else {
            if (verbose == '\x01') {
              piStack_d0 = (int *)0x103949;
              puts("Loading reachable states.");
            }
            piStack_d0 = (int *)0x103951;
            new_rel = (MTBDD)set_load_RUN((FILE *)pFVar4);
            local_34 = 0;
            piStack_d0 = (int *)0x10396d;
            sVar5 = fread(&local_34,4,1,pFVar4);
            if (sVar5 != 1) {
              local_34 = 0;
            }
            new_states = (MTBDD)&stack0xffffffffffffff38;
            lVar18 = -((ulong)local_34 * 8 + 0xf & 0xfffffffffffffff0);
            __ptr_00 = (undefined1 *)((long)&stack0xffffffffffffff38 + lVar18);
            new_initial = (MTBDD)__ptr_00;
            uVar16 = 0;
            uVar6 = (ulong)local_34;
            if ((int)local_34 < 1) {
              uVar6 = uVar16;
            }
            *(undefined8 *)((long)&piStack_d0 + lVar18) = 1;
            sVar5 = *(size_t *)((long)&piStack_d0 + lVar18);
            MStack_40 = uVar6;
            for (; MStack_40 != uVar16; uVar16 = uVar16 + 1) {
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 4;
              sVar7 = *(size_t *)((long)&piStack_d0 + lVar18);
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x1039cd;
              sVar7 = fread(local_90,sVar7,sVar5,pFVar4);
              if (sVar7 != 1) {
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x14;
                sVar5 = *(size_t *)((long)&piStack_d0 + lVar18);
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 1;
                sVar7 = *(size_t *)((long)&piStack_d0 + lVar18);
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x1042a4;
                fwrite("Invalid input file!\n",sVar5,sVar7,_stderr);
                uVar14 = 0x244;
                goto LAB_001042e0;
              }
              uVar6 = (ulong)local_90 & 0xffffffff;
              uVar15 = local_90._0_4_ + 1;
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x1039ea;
              __ptr = malloc((ulong)uVar15);
              *(void **)(new_initial + uVar16 * 8) = __ptr;
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103a0c;
              sVar5 = fread(__ptr,sVar5,uVar6,pFVar4);
              if (sVar5 != uVar6) {
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x14;
                sVar5 = *(size_t *)((long)&piStack_d0 + lVar18);
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 1;
                sVar7 = *(size_t *)((long)&piStack_d0 + lVar18);
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x104277;
                fwrite("Invalid input file!\n",sVar5,sVar7,_stderr);
                uVar14 = 0x246;
                goto LAB_001042e0;
              }
              *(undefined1 *)((long)__ptr + uVar6) = 0;
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 1;
              sVar5 = *(size_t *)((long)&piStack_d0 + lVar18);
            }
            *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103a31;
            fclose(pFVar4);
            uVar6 = 0;
            *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103a49;
            printf("Read file %s.\n");
            MVar10 = new_rel;
            if (verbose != '\0') {
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103a77;
              printf("%d integers per state, %d transition groups\n",(ulong)(uint)vector_size,
                     (ulong)(uint)next_count);
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103a83;
              puts("LDD nodes:");
              MVar9 = local_50->dd;
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103a8f;
              lddmc_nodecount(MVar9);
              *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103aa0;
              printf("Initial states: %zu LDD nodes\n");
              for (uVar16 = 0; (long)uVar16 < (long)next_count; uVar16 = uVar16 + 1) {
                MVar9 = next[uVar16]->dd;
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103ac9;
                sVar8 = lddmc_nodecount(MVar9);
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103ad9;
                printf("Transition %d: %zu LDD nodes\n",uVar16 & 0xffffffff,sVar8);
              }
              if (verbose == '\x01') {
                *(undefined8 *)((long)&piStack_d0 + lVar18) = 0x103af3;
                puts("Preparing conversion to BDD...");
              }
            }
            prVar19 = (rel_t)(__ptr_00 + -((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0))
            ;
            uVar16 = 0;
            if (0 < vector_size) {
              uVar16 = (ulong)(uint)vector_size;
            }
            for (; uVar16 != uVar6; uVar6 = uVar6 + 1) {
              *(undefined4 *)((long)&prVar19->dd + uVar6 * 4) = 0;
            }
            local_80 = *(FILE **)MVar10;
            local_90 = (undefined1  [8])compute_highest_WRAP;
            _len = (_Worker *)0x1;
            prStack_78 = prVar19;
            prVar19[-1].w_proj = (int *)0x103b53;
            lace_run_task((Task *)local_90);
            local_44 = 0;
            for (lVar18 = 0; lVar18 < next_count; lVar18 = lVar18 + 1) {
              local_80 = (FILE *)next[lVar18]->dd;
              prStack_78 = (rel_t)next[lVar18]->meta;
              local_90 = (undefined1  [8])compute_highest_action_WRAP;
              _len = (_Worker *)0x1;
              local_70 = &local_44;
              prVar19[-1].w_proj = (int *)0x103ba0;
              lace_run_task((Task *)local_90);
            }
            __ptr_00 = (undefined1 *)
                       ((long)prVar19 - ((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
            uVar6 = 0;
            uVar16 = 0;
            if (0 < vector_size) {
              uVar16 = (ulong)(uint)vector_size;
            }
            *(undefined8 *)(__ptr_00 + -8) = 0xffffffffffffffff;
            uVar13 = *(ulong *)(__ptr_00 + -8);
            for (; uVar6 != uVar16; uVar6 = uVar6 + 1) {
              uVar15 = *(uint *)((long)&prVar19->dd + uVar6 * 4);
              iVar12 = 0;
              while (uVar15 != 0) {
                iVar12 = iVar12 + 1;
                *(int *)(__ptr_00 + uVar6 * 4) = iVar12;
                uVar15 = uVar15 >> 1;
                *(uint *)((long)&prVar19->dd + uVar6 * 4) = uVar15;
              }
              *(uint *)(__ptr_00 + uVar6 * 4) = iVar12 + (uint)(iVar12 == 0);
            }
            actionbits = 0;
            *(undefined8 *)(__ptr_00 + -8) = 1;
            uVar15 = local_44;
            uVar6 = *(ulong *)(__ptr_00 + -8);
            *(undefined8 *)(__ptr_00 + -8) = 1;
            MVar9 = *(MDD *)(__ptr_00 + -8);
            while (iVar12 = (int)uVar6, uVar15 != 0) {
              uVar15 = uVar15 >> 1;
              local_44 = uVar15;
              uVar6 = (ulong)(iVar12 + 1);
              actionbits = iVar12;
            }
            if ((iVar12 == 1) && ((has_actions & 1) != 0)) {
              actionbits = 1;
            }
            if (verbose != '\0') {
              *(undefined8 *)(__ptr_00 + -8) = 0x103c51;
              printf("Bits per level: ");
              for (lVar18 = 0; lVar18 < vector_size; lVar18 = lVar18 + 1) {
                if (lVar18 != 0) {
                  *(undefined8 *)(__ptr_00 + -8) = 0x103c7d;
                  printf(", ");
                }
                uVar15 = *(uint *)(__ptr_00 + lVar18 * 4);
                *(undefined8 *)(__ptr_00 + -8) = 0x103c8c;
                printf("%d",(ulong)uVar15);
              }
              *(undefined8 *)(__ptr_00 + -8) = 10;
              uVar14 = *(undefined8 *)(__ptr_00 + -8);
              *(undefined8 *)(__ptr_00 + -8) = 0x103c99;
              putchar((int)uVar14);
              *(undefined8 *)(__ptr_00 + -8) = 0x103cad;
              printf("Action bits: %d.\n");
              *(undefined8 *)(__ptr_00 + -8) = 0xffffffffffffffff;
              uVar13 = *(ulong *)(__ptr_00 + -8);
            }
            for (iVar12 = 0; iVar12 < vector_size; iVar12 = iVar12 + 1) {
              uVar1 = *(uint32_t *)(__ptr_00 + (long)(vector_size + (int)uVar13) * 4);
              *(undefined8 *)(__ptr_00 + -8) = 0x103cd1;
              MVar9 = lddmc_makenode(uVar1,MVar9,0);
              uVar13 = (ulong)((int)uVar13 - 1);
            }
            MStack_40 = MVar9;
            *(undefined8 *)(__ptr_00 + -8) = 0x103ce7;
            lddmc_ref(MVar9);
            uVar16 = 0;
            uVar6 = (ulong)(uint)vector_size;
            if (vector_size < 1) {
              uVar6 = uVar16;
            }
            iVar12 = 0;
            for (; uVar6 != uVar16; uVar16 = uVar16 + 1) {
              iVar12 = iVar12 + *(int *)(__ptr_00 + uVar16 * 4);
            }
            local_b8 = 0x8000000000000000;
            iVar17 = 0;
            if (0 < iVar12) {
              iVar17 = iVar12;
            }
            uVar1 = iVar12 * 2;
            while( true ) {
              MVar10 = local_b8;
              uVar1 = uVar1 - 2;
              bVar20 = iVar17 == 0;
              iVar17 = iVar17 + -1;
              if (bVar20) break;
              *(undefined8 *)(__ptr_00 + -8) = 0x103d3b;
              local_b8 = mtbdd_makenode(uVar1,0,MVar10);
            }
            *(undefined8 *)(__ptr_00 + -8) = 0x103d53;
            mtbdd_protect(&stack0xffffffffffffff48);
            if (verbose != '\0') {
              *(undefined8 *)(__ptr_00 + -8) = 0x103d68;
              puts("Converting to BDD...");
            }
            *(undefined8 *)(__ptr_00 + -8) = 0x103d7b;
            pFVar4 = fopen(bdd_filename,"w");
            if (pFVar4 != (FILE *)0x0) {
              *(undefined8 *)(__ptr_00 + -8) = 4;
              sVar5 = *(size_t *)(__ptr_00 + -8);
              *(undefined8 *)(__ptr_00 + -8) = 1;
              sVar7 = *(size_t *)(__ptr_00 + -8);
              *(undefined8 *)(__ptr_00 + -8) = 0x103da3;
              fwrite(&vector_size,sVar5,sVar7,pFVar4);
              *(undefined8 *)(__ptr_00 + -8) = 0x103db8;
              fwrite(__ptr_00,sVar5,(long)vector_size,pFVar4);
              *(undefined8 *)(__ptr_00 + -8) = 0x103dcd;
              fwrite(&actionbits,sVar5,sVar7,pFVar4);
              MVar3 = MStack_40;
              psVar11 = local_50;
              MVar9 = local_50->dd;
              *(undefined8 *)(__ptr_00 + -8) = 0x103ddd;
              MVar10 = bdd_from_ldd_RUN(MVar9,MVar3,arg_3);
              state_vars = MVar10;
              *(undefined8 *)(__ptr_00 + -8) = 0x103df5;
              dVar21 = mtbdd_satcount_RUN(MVar10,(long)iVar12);
              MVar9 = psVar11->dd;
              *(undefined8 *)(__ptr_00 + -8) = 0x103e1c;
              lVar22 = lddmc_satcount_cached_RUN(MVar9);
              if (((long)(dVar21 - 9.223372036854776e+18) & (long)dVar21 >> 0x3f | (long)dVar21) !=
                  ((long)lVar22 >> 0x3f & (long)(lVar22 - 9.223372036854776e+18) | (long)lVar22)) {
                *(undefined8 *)(__ptr_00 + -8) = 0x10442e;
                __assert_fail("(size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                              ,0x2a8,"void run_WORK(WorkerP *, Task *)");
              }
              *(undefined8 *)(__ptr_00 + -8) = 0x103e4c;
              mtbdd_refs_push(MVar10);
              local_90._0_4_ = 0xffffffff;
              *(undefined8 *)(__ptr_00 + -8) = 4;
              sVar5 = *(size_t *)(__ptr_00 + -8);
              *(undefined8 *)(__ptr_00 + -8) = 1;
              sVar7 = *(size_t *)(__ptr_00 + -8);
              *(undefined8 *)(__ptr_00 + -8) = 0x103e64;
              fwrite(local_90,sVar5,sVar7,pFVar4);
              *(undefined8 *)(__ptr_00 + -8) = 0x103e73;
              mtbdd_writer_tobinary_RUN((FILE *)pFVar4,&state_vars,arg_3_00);
              MVar3 = MStack_40;
              MVar10 = new_rel;
              MVar9 = *(MDD *)new_rel;
              *(undefined8 *)(__ptr_00 + -8) = 0x103e86;
              psVar11 = (set_t)bdd_from_ldd_RUN(MVar9,MVar3,arg_3_01);
              local_c8 = psVar11;
              *(undefined8 *)(__ptr_00 + -8) = 0x103e9b;
              dVar21 = mtbdd_satcount_RUN((MTBDD)psVar11,(long)iVar12);
              MVar9 = *(MDD *)MVar10;
              *(undefined8 *)(__ptr_00 + -8) = 0x103ec6;
              lVar22 = lddmc_satcount_cached_RUN(MVar9);
              if (((long)(dVar21 - 9.223372036854776e+18) & (long)dVar21 >> 0x3f | (long)dVar21) !=
                  ((long)lVar22 >> 0x3f & (long)(lVar22 - 9.223372036854776e+18) | (long)lVar22)) {
                *(code **)(__ptr_00 + -8) = main;
                __assert_fail("(size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                              ,0x2b2,"void run_WORK(WorkerP *, Task *)");
              }
              *(undefined8 *)(__ptr_00 + -8) = 0x103ef6;
              mtbdd_refs_push((MTBDD)psVar11);
              MVar10 = state_vars;
              if (verbose == '\x01') {
                *(undefined8 *)(__ptr_00 + -8) = 0x103f0b;
                sVar8 = mtbdd_nodecount(MVar10);
                *(undefined8 *)(__ptr_00 + -8) = 0x103f1c;
                printf("Initial states: %zu BDD nodes\n",sVar8);
                *(undefined8 *)(__ptr_00 + -8) = 0x103f24;
                sVar8 = mtbdd_nodecount((MTBDD)psVar11);
                *(undefined8 *)(__ptr_00 + -8) = 0x103f35;
                printf("Reachable states: %zu BDD nodes\n",sVar8);
              }
              *(undefined8 *)(__ptr_00 + -8) = 4;
              sVar5 = *(size_t *)(__ptr_00 + -8);
              *(undefined8 *)(__ptr_00 + -8) = 1;
              sVar7 = *(size_t *)(__ptr_00 + -8);
              *(undefined8 *)(__ptr_00 + -8) = 0x103f51;
              fwrite(&next_count,sVar5,sVar7,pFVar4);
              for (lVar18 = 0; uVar6 = (ulong)next_count, lVar18 < (long)uVar6; lVar18 = lVar18 + 1)
              {
                prVar19 = next[lVar18];
                *(undefined8 *)(__ptr_00 + -8) = 0x103f7d;
                fwrite(&prVar19->r_k,sVar5,sVar7,pFVar4);
                prVar19 = next[lVar18];
                *(undefined8 *)(__ptr_00 + -8) = 0x103f9a;
                fwrite(&prVar19->w_k,sVar5,sVar7,pFVar4);
                piVar2 = next[lVar18]->r_proj;
                iVar12 = next[lVar18]->r_k;
                *(undefined8 *)(__ptr_00 + -8) = 0x103fb8;
                fwrite(piVar2,sVar5,(long)iVar12,pFVar4);
                piVar2 = next[lVar18]->w_proj;
                iVar12 = next[lVar18]->w_k;
                *(undefined8 *)(__ptr_00 + -8) = 0x103fd6;
                fwrite(piVar2,sVar5,(long)iVar12,pFVar4);
              }
              local_50 = psVar11;
              uVar16 = 0;
              MVar9 = MStack_40;
              do {
                if ((long)(int)uVar6 <= (long)uVar16) {
                  if (no_reachable != '\0') {
                    local_38 = 0;
                  }
                  *(undefined8 *)(__ptr_00 + -8) = 4;
                  sVar5 = *(size_t *)(__ptr_00 + -8);
                  *(undefined8 *)(__ptr_00 + -8) = 1;
                  sVar7 = *(size_t *)(__ptr_00 + -8);
                  *(undefined8 *)(__ptr_00 + -8) = 0x104183;
                  fwrite(&local_38,sVar5,sVar7,pFVar4);
                  if (local_38 != 0) {
                    local_90._0_4_ = 0xffffffff;
                    *(undefined8 *)(__ptr_00 + -8) = 4;
                    sVar5 = *(size_t *)(__ptr_00 + -8);
                    *(undefined8 *)(__ptr_00 + -8) = 1;
                    sVar7 = *(size_t *)(__ptr_00 + -8);
                    *(undefined8 *)(__ptr_00 + -8) = 0x1041a0;
                    fwrite(local_90,sVar5,sVar7,pFVar4);
                    *(undefined8 *)(__ptr_00 + -8) = 0x1041af;
                    mtbdd_writer_tobinary_RUN
                              ((FILE *)pFVar4,(MTBDD *)&stack0xffffffffffffff38,arg_3_04);
                  }
                  *(undefined8 *)(__ptr_00 + -8) = 1;
                  sVar5 = *(size_t *)(__ptr_00 + -8);
                  *(undefined8 *)(__ptr_00 + -8) = 0x1041ba;
                  mtbdd_refs_pop(sVar5);
                  *(undefined8 *)(__ptr_00 + -8) = 4;
                  sVar7 = *(size_t *)(__ptr_00 + -8);
                  *(undefined8 *)(__ptr_00 + -8) = 0x1041cf;
                  fwrite(&local_34,sVar7,sVar5,pFVar4);
                  uVar16 = 0;
                  uVar6 = (ulong)local_34;
                  if ((int)local_34 < 1) {
                    uVar6 = uVar16;
                  }
                  for (; uVar6 != uVar16; uVar16 = uVar16 + 1) {
                    __s = *(char **)(new_initial + uVar16 * 8);
                    *(undefined8 *)(__ptr_00 + -8) = 0x1041f4;
                    sVar7 = strlen(__s);
                    local_90._0_4_ = (int)sVar7;
                    *(undefined8 *)(__ptr_00 + -8) = 4;
                    sVar7 = *(size_t *)(__ptr_00 + -8);
                    *(undefined8 *)(__ptr_00 + -8) = 0x10420f;
                    fwrite(local_90,sVar7,sVar5,pFVar4);
                    uVar13 = (ulong)local_90 & 0xffffffff;
                    *(undefined8 *)(__ptr_00 + -8) = 0x104223;
                    fwrite(__s,sVar5,uVar13,pFVar4);
                  }
                  *(undefined8 *)(__ptr_00 + -8) = 0x104230;
                  fclose(pFVar4);
                  *(undefined8 *)(__ptr_00 + -8) = 0x104245;
                  printf("Written file %s.\n",bdd_filename);
                  return;
                }
                MVar3 = next[uVar16]->dd;
                arg_4 = next[uVar16]->meta;
                *(undefined8 *)(__ptr_00 + -8) = 0x104017;
                MVar10 = bdd_from_ldd_rel_RUN(MVar3,MVar9,0,arg_4);
                local_a0 = MVar10;
                *(undefined8 *)(__ptr_00 + -8) = 0x104026;
                mtbdd_refs_push(MVar10);
                *(undefined8 *)(__ptr_00 + -8) = 0x104031;
                mtbdd_writer_tobinary_RUN((FILE *)pFVar4,&local_a0,arg_3_02);
                MVar10 = local_a0;
                if (verbose == '\x01') {
                  *(undefined8 *)(__ptr_00 + -8) = 0x104046;
                  sVar8 = mtbdd_nodecount(MVar10);
                  *(undefined8 *)(__ptr_00 + -8) = 0x10405a;
                  printf("Transition %d: %zu BDD nodes\n",uVar16 & 0xffffffff,sVar8);
                }
                if (check_results == '\x01') {
                  MVar3 = next[uVar16]->meta;
                  *(undefined8 *)(__ptr_00 + -8) = 0x104080;
                  MVar10 = meta_to_bdd(MVar3,MVar9,0);
                  *(undefined8 *)(__ptr_00 + -8) = 0x10408b;
                  mtbdd_refs_push(MVar10);
                  local_90 = (undefined1  [8])sylvan_relnext_WRAP;
                  _len = (_Worker *)0x1;
                  local_80 = (FILE *)local_50;
                  prStack_78 = (rel_t)local_a0;
                  local_68[0] = '\0';
                  local_68[1] = '\0';
                  local_68[2] = '\0';
                  local_68[3] = '\0';
                  local_70 = (uint *)MVar10;
                  *(undefined8 *)(__ptr_00 + -8) = 0x1040cb;
                  lace_run_task((Task *)local_90);
                  mtbdd = local_80;
                  *(undefined8 *)(__ptr_00 + -8) = 0x1040d7;
                  mtbdd_refs_push((MTBDD)mtbdd);
                  local_80 = *(FILE **)new_rel;
                  prStack_78 = (rel_t)next[uVar16]->dd;
                  local_70 = (uint *)next[uVar16]->meta;
                  local_90 = (undefined1  [8])lddmc_relprod_WRAP;
                  _len = (_Worker *)0x1;
                  *(undefined8 *)(__ptr_00 + -8) = 0x104117;
                  lace_run_task((Task *)local_90);
                  lddmc = local_80;
                  *(undefined8 *)(__ptr_00 + -8) = 0x104123;
                  lddmc_refs_push((MDD)lddmc);
                  MVar9 = MStack_40;
                  *(undefined8 *)(__ptr_00 + -8) = 0x104132;
                  psVar11 = (set_t)bdd_from_ldd_RUN((MDD)lddmc,MVar9,arg_3_03);
                  if (mtbdd != (FILE *)psVar11) {
                    *(undefined8 *)(__ptr_00 + -8) = 0x12;
                    sVar5 = *(size_t *)(__ptr_00 + -8);
                    *(undefined8 *)(__ptr_00 + -8) = 1;
                    sVar7 = *(size_t *)(__ptr_00 + -8);
                    *(undefined8 *)(__ptr_00 + -8) = 0x1042d1;
                    fwrite("Conversion error!\n",sVar5,sVar7,_stderr);
                    uVar14 = 0x2db;
                    goto LAB_001042e0;
                  }
                  *(undefined8 *)(__ptr_00 + -8) = 1;
                  lVar18 = *(long *)(__ptr_00 + -8);
                  *(undefined8 *)(__ptr_00 + -8) = 0x104143;
                  lddmc_refs_pop(lVar18);
                  *(undefined8 *)(__ptr_00 + -8) = 2;
                  lVar18 = *(long *)(__ptr_00 + -8);
                  *(undefined8 *)(__ptr_00 + -8) = 0x10414b;
                  mtbdd_refs_pop(lVar18);
                }
                *(undefined8 *)(__ptr_00 + -8) = 1;
                lVar18 = *(long *)(__ptr_00 + -8);
                *(undefined8 *)(__ptr_00 + -8) = 0x104153;
                mtbdd_refs_pop(lVar18);
                uVar16 = uVar16 + 1;
                uVar6 = (ulong)(uint)next_count;
              } while( true );
            }
            *(undefined8 *)(__ptr_00 + -8) = 0x1043fb;
            fprintf(_stderr,"Cannot open file \'%s\'!\n",bdd_filename);
            uVar14 = 0x29f;
          }
        }
        else {
          piStack_d0 = (int *)0x104398;
          fwrite("Input file missing reachable states!\n",0x25,1,_stderr);
          uVar14 = 0x234;
          __ptr_00 = (undefined1 *)&stack0xffffffffffffff38;
        }
      }
      else {
        piStack_d0 = (int *)0x104368;
        fwrite("Invalid input file!\n",0x14,1,_stderr);
        uVar14 = 0x22a;
        __ptr_00 = (undefined1 *)&stack0xffffffffffffff38;
      }
    }
    else {
      piStack_d0 = (int *)0x10433b;
      fwrite("Invalid input file!\n",0x14,1,_stderr);
      uVar14 = 0x223;
      __ptr_00 = (undefined1 *)&stack0xffffffffffffff38;
    }
  }
LAB_001042e0:
  *(undefined8 *)(__ptr_00 + -8) = 0x1042e7;
  fprintf(_stderr,"Abort at line %d!\n",uVar14);
  *(undefined8 *)(__ptr_00 + -8) = 0xffffffffffffffff;
  uVar14 = *(undefined8 *)(__ptr_00 + -8);
  *(undefined8 *)(__ptr_00 + -8) = 0x1042ef;
  exit((int)uVar14);
}

Assistant:

VOID_TASK_0(run)
{
    // Open file
    FILE *f = fopen(model_filename, "rb");
    if (f == NULL) Abort("Cannot open file '%s'!\n", model_filename);

    // Read integers per vector
    if (fread(&vector_size, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");

    // Read initial state
    if (verbose) printf("Loading initial state.\n");
    set_t initial = set_load(f);

    // Read number of transitions
    if (fread(&next_count, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    next = (rel_t*)malloc(sizeof(rel_t) * next_count);

    // Read transitions
    if (verbose) printf("Loading transition relations.\n");
    for (int i=0; i<next_count; i++) next[i] = rel_load_proj(f);
    for (int i=0; i<next_count; i++) rel_load(f, next[i]);

    // Read whether reachable states are stored
    int has_reachable = 0;
    if (fread(&has_reachable, sizeof(int), 1, f) != 1) Abort("Input file missing reachable states!\n");
    if (has_reachable == 0) Abort("Input file missing reachable states!\n");

    // Read reachable states
    if (verbose) printf("Loading reachable states.\n");
    set_t states = set_load(f);
    
    // Read number of action labels
    int action_labels_count = 0;
    if (fread(&action_labels_count, sizeof(int), 1, f) != 1) action_labels_count = 0;
    // ignore: Abort("Input file missing action label count!\n");

    // Read action labels
    char *action_labels[action_labels_count];
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len;
        if (fread(&len, sizeof(uint32_t), 1, f) != 1) Abort("Invalid input file!\n");
        action_labels[i] = (char*)malloc(sizeof(char[len+1]));
        if (fread(action_labels[i], sizeof(char), len, f) != len) Abort("Invalid input file!\n");
        action_labels[i][len] = 0;
    }

    // Close file
    fclose(f);

    // Report that we have read the input file
    printf("Read file %s.\n", model_filename);

    // Report statistics
    if (verbose) {
        printf("%d integers per state, %d transition groups\n", vector_size, next_count);
        printf("LDD nodes:\n");
        printf("Initial states: %zu LDD nodes\n", lddmc_nodecount(initial->dd));
        for (int i=0; i<next_count; i++) {
            printf("Transition %d: %zu LDD nodes\n", i, lddmc_nodecount(next[i]->dd));
        }
    }

    // Report that we prepare BDD conversion
    if (verbose) printf("Preparing conversion to BDD...\n");

    // Compute highest value at each level (from reachable states)
    uint32_t highest[vector_size];
    for (int i=0; i<vector_size; i++) highest[i] = 0;
    compute_highest(states->dd, highest);

    // Compute highest action label value (from transition relations)
    uint32_t highest_action = 0;
    for (int i=0; i<next_count; i++) {
        compute_highest_action(next[i]->dd, next[i]->meta, &highest_action);
    }

    // Compute number of bits for each level
    int bits[vector_size];
    for (int i=0; i<vector_size; i++) {
        bits[i] = 0;
        while (highest[i] != 0) {
            bits[i]++;
            highest[i]>>=1;
        }
        if (bits[i] == 0) bits[i] = 1;
    }

    // Compute number of bits for action label
    actionbits = 0;
    while (highest_action != 0) {
        actionbits++;
        highest_action>>=1;
    }
    if (actionbits == 0 && has_actions) actionbits = 1;

    // Report number of bits
    if (verbose) {
        printf("Bits per level: ");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(", ");
            printf("%d", bits[i]);
        }
        printf("\n");
        printf("Action bits: %d.\n", actionbits);
    }

    // Compute bits MDD
    MDD bits_dd = lddmc_true;
    for (int i=0; i<vector_size; i++) {
        bits_dd = lddmc_makenode(bits[vector_size-i-1], bits_dd, lddmc_false);
    }
    lddmc_ref(bits_dd);

    // Compute total number of bits
    int totalbits = 0;
    for (int i=0; i<vector_size; i++) {
        totalbits += bits[i];
    }

    // Compute state variables
    MTBDD state_vars = mtbdd_true;
    for (int i=0; i<totalbits; i++) {
        state_vars = mtbdd_makenode(2*(totalbits-i-1), mtbdd_false, state_vars);
    }
    mtbdd_protect(&state_vars);

    // Report that we begin the actual conversion
    if (verbose) printf("Converting to BDD...\n");

    // Create BDD file
    f = fopen(bdd_filename, "w");
    if (f == NULL) Abort("Cannot open file '%s'!\n", bdd_filename);

    // Write domain...
    fwrite(&vector_size, sizeof(int), 1, f);
    fwrite(bits, sizeof(int), vector_size, f);
    fwrite(&actionbits, sizeof(int), 1, f);

    // Write initial state...
    MTBDD new_initial = bdd_from_ldd(initial->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd));
    mtbdd_refs_push(new_initial);
    {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_initial, 1);
    }

    // Custom operation that converts to BDD given number of bits for each level
    MTBDD new_states = bdd_from_ldd(states->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd));
    mtbdd_refs_push(new_states);

    // Report size of BDD
    if (verbose) {
        printf("Initial states: %zu BDD nodes\n", mtbdd_nodecount(new_initial));
        printf("Reachable states: %zu BDD nodes\n", mtbdd_nodecount(new_states));
    }

    // Write number of transitions
    fwrite(&next_count, sizeof(int), 1, f);

    // Write meta for each transition
    for (int i=0; i<next_count; i++) {
        fwrite(&next[i]->r_k, sizeof(int), 1, f);
        fwrite(&next[i]->w_k, sizeof(int), 1, f);
        fwrite(next[i]->r_proj, sizeof(int), next[i]->r_k, f);
        fwrite(next[i]->w_proj, sizeof(int), next[i]->w_k, f);
    }

    // Write BDD for each transition
    for (int i=0; i<next_count; i++) {
        // Compute new transition relation
        MTBDD new_rel = bdd_from_ldd_rel(next[i]->dd, bits_dd, 0, next[i]->meta);
        mtbdd_refs_push(new_rel);
        mtbdd_writer_tobinary(f, &new_rel, 1);

        // Report number of nodes
        if (verbose) printf("Transition %d: %zu BDD nodes\n", i, mtbdd_nodecount(new_rel));

        if (check_results) {
            // Compute new <variables> for the current transition relation
            MTBDD new_vars = meta_to_bdd(next[i]->meta, bits_dd, 0);
            mtbdd_refs_push(new_vars);

            // Test if the transition is correctly converted
            MTBDD test = sylvan_relnext(new_states, new_rel, new_vars);
            mtbdd_refs_push(test);
            MDD succ = lddmc_relprod(states->dd, next[i]->dd, next[i]->meta);
            lddmc_refs_push(succ);
            MTBDD test2 = bdd_from_ldd(succ, bits_dd, 0);
            if (test != test2) Abort("Conversion error!\n");
            lddmc_refs_pop(1);
            mtbdd_refs_pop(2);
        }

        mtbdd_refs_pop(1);
    }

    // Write reachable states
    if (no_reachable) has_reachable = 0;
    fwrite(&has_reachable, sizeof(int), 1, f);
    if (has_reachable) {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_states, 1);
    }
    mtbdd_refs_pop(1);  // new_states

    // Write action labels
    fwrite(&action_labels_count, sizeof(int), 1, f);
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len = strlen(action_labels[i]);
        fwrite(&len, sizeof(uint32_t), 1, f);
        fwrite(action_labels[i], sizeof(char), len, f);
    }

    // Close the file
    fclose(f);

    // Report to the user
    printf("Written file %s.\n", bdd_filename);
}